

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm.cpp
# Opt level: O2

Tag * __thiscall
wasm::Module::addTag(Module *this,unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_> *curr)

{
  Tag *pTVar1;
  string local_40;
  _Head_base<0UL,_wasm::Tag_*,_false> local_20;
  allocator<char> local_11;
  
  local_20._M_head_impl =
       (curr->_M_t).super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>._M_t.
       super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
       super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl;
  (curr->_M_t).super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>._M_t.
  super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
  super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl = (Tag *)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"addTag",&local_11);
  pTVar1 = addModuleElement<std::vector<std::unique_ptr<wasm::Tag,std::default_delete<wasm::Tag>>,std::allocator<std::unique_ptr<wasm::Tag,std::default_delete<wasm::Tag>>>>,std::unordered_map<wasm::Name,wasm::Tag*,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Tag*>>>,wasm::Tag>
                     (&this->tags,&this->tagsMap,
                      (unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_> *)&local_20,&local_40)
  ;
  std::__cxx11::string::~string((string *)&local_40);
  std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>::~unique_ptr
            ((unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_> *)&local_20);
  return pTVar1;
}

Assistant:

Tag* Module::addTag(std::unique_ptr<Tag>&& curr) {
  return addModuleElement(tags, tagsMap, std::move(curr), "addTag");
}